

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_event_decoder.c
# Opt level: O3

int pt_evt_find_header_fup(pt_packet *packet,pt_packet_decoder *pacdec)

{
  pt_packet_type pVar1;
  int iVar2;
  pt_packet_decoder decoder;
  pt_packet_decoder local_140;
  
  iVar2 = -1;
  if (pacdec != (pt_packet_decoder *)0x0 && packet != (pt_packet *)0x0) {
    memcpy(&local_140,pacdec,0x128);
    iVar2 = pt_pkt_next(&local_140,packet,0x18);
    if (-1 < iVar2) {
      do {
        pVar1 = packet->type;
        if (7 < pVar1 - ppt_mode) {
          iVar2 = -6;
          switch(pVar1) {
          case ppt_invalid:
          case ppt_pad:
            break;
          case ppt_unknown:
          case ppt_psb:
            goto switchD_00107a99_caseD_1;
          case ppt_psbend:
            return 0;
          case ppt_fup:
            return 1;
          default:
            if (pVar1 != ppt_mnt) {
              if (pVar1 == ppt_ovf) {
                return 0;
              }
              return -6;
            }
          }
        }
        iVar2 = pt_pkt_next(&local_140,packet,0x18);
      } while (-1 < iVar2);
    }
  }
switchD_00107a99_caseD_1:
  return iVar2;
}

Assistant:

static int pt_evt_find_header_fup(struct pt_packet *packet,
				  const struct pt_packet_decoder *pacdec)
{
	struct pt_packet_decoder decoder;

	if (!packet || !pacdec)
		return -pte_internal;

	decoder = *pacdec;
	for (;;) {
		int errcode;

		errcode = pt_pkt_next(&decoder, packet, sizeof(*packet));
		if (errcode < 0)
			return errcode;

		switch (packet->type) {
		case ppt_fup:
			/* Found it. */
			return 1;

		case ppt_mode:
		case ppt_pip:
		case ppt_vmcs:
		case ppt_mnt:
		case ppt_tsc:
		case ppt_cbr:
		case ppt_tma:
		case ppt_mtc:
		case ppt_cyc:
		case ppt_pad:
		case ppt_invalid:
			/* Ignore the packet. */
			break;

		case ppt_psbend:
		case ppt_ovf:
			/* There's no FUP in here. */
			return 0;

		default:
			return -pte_bad_context;
		}
	}
}